

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkbox.cpp
# Opt level: O0

void __thiscall ftxui::anon_unknown_3::CheckboxBase::~CheckboxBase(CheckboxBase *this)

{
  CheckboxBase *this_local;
  
  ~CheckboxBase(this);
  operator_delete(this,0x110);
  return;
}

Assistant:

CheckboxBase(ConstStringRef label, bool* state, Ref<CheckboxOption> option)
      : label_(label), state_(state), option_(std::move(option)) {
#if defined(FTXUI_MICROSOFT_TERMINAL_FALLBACK)
    // Microsoft terminal do not use fonts able to render properly the default
    // radiobox glyph.
    if (option_->style_checked == "▣ ")
      option_->style_checked = "[X]";
    if (option_->style_unchecked == "☐ ")
      option_->style_unchecked = "[ ]";
#endif
  }